

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

TYPE ON_COMPONENT_INDEX::Type(int i)

{
  TYPE local_10;
  TYPE t;
  int i_local;
  
  local_10 = invalid_type;
  switch(i) {
  case 1:
    local_10 = brep_vertex;
    break;
  case 2:
    local_10 = brep_edge;
    break;
  case 3:
    local_10 = brep_face;
    break;
  case 4:
    local_10 = brep_trim;
    break;
  case 5:
    local_10 = brep_loop;
    break;
  case 0xb:
    local_10 = mesh_vertex;
    break;
  case 0xc:
    local_10 = meshtop_vertex;
    break;
  case 0xd:
    local_10 = meshtop_edge;
    break;
  case 0xe:
    local_10 = mesh_face;
    break;
  case 0xf:
    local_10 = mesh_ngon;
    break;
  case 0x15:
    local_10 = idef_part;
    break;
  case 0x1f:
    local_10 = polycurve_segment;
    break;
  case 0x29:
    local_10 = pointcloud_point;
    break;
  case 0x33:
    local_10 = group_member;
    break;
  case 0x3d:
    local_10 = extrusion_bottom_profile;
    break;
  case 0x3e:
    local_10 = extrusion_top_profile;
    break;
  case 0x3f:
    local_10 = extrusion_wall_edge;
    break;
  case 0x40:
    local_10 = extrusion_wall_surface;
    break;
  case 0x41:
    local_10 = extrusion_cap_surface;
    break;
  case 0x42:
    local_10 = extrusion_path;
    break;
  case 0x47:
    local_10 = subd_vertex;
    break;
  case 0x48:
    local_10 = subd_edge;
    break;
  case 0x49:
    local_10 = subd_face;
    break;
  case 0x51:
    local_10 = hatch_loop;
    break;
  case 100:
    local_10 = dim_linear_point;
    break;
  case 0x65:
    local_10 = dim_radial_point;
    break;
  case 0x66:
    local_10 = dim_angular_point;
    break;
  case 0x67:
    local_10 = dim_ordinate_point;
    break;
  case 0x68:
    local_10 = dim_text_point;
    break;
  case 0x69:
    local_10 = dim_centermark_point;
    break;
  case 0x6a:
    local_10 = dim_leader_point;
    break;
  case -1:
    local_10 = no_type;
  }
  return local_10;
}

Assistant:

ON_COMPONENT_INDEX::TYPE ON_COMPONENT_INDEX::Type(int i)
{
  TYPE t = invalid_type;
  switch((unsigned int)i)
  {
  case ON_COMPONENT_INDEX::no_type:            t = ON_COMPONENT_INDEX::no_type;            break;
  
  case ON_COMPONENT_INDEX::brep_vertex:        t = ON_COMPONENT_INDEX::brep_vertex;        break;
  case ON_COMPONENT_INDEX::brep_edge:          t = ON_COMPONENT_INDEX::brep_edge;          break;
  case ON_COMPONENT_INDEX::brep_face:          t = ON_COMPONENT_INDEX::brep_face;          break;
  case ON_COMPONENT_INDEX::brep_trim:          t = ON_COMPONENT_INDEX::brep_trim;          break;
  case ON_COMPONENT_INDEX::brep_loop:          t = ON_COMPONENT_INDEX::brep_loop;          break;
  
  case ON_COMPONENT_INDEX::mesh_vertex:        t = ON_COMPONENT_INDEX::mesh_vertex;        break;
  case ON_COMPONENT_INDEX::meshtop_vertex:     t = ON_COMPONENT_INDEX::meshtop_vertex;     break;
  case ON_COMPONENT_INDEX::meshtop_edge:       t = ON_COMPONENT_INDEX::meshtop_edge;       break;
  case ON_COMPONENT_INDEX::mesh_face:          t = ON_COMPONENT_INDEX::mesh_face;          break;
  case ON_COMPONENT_INDEX::mesh_ngon:          t = ON_COMPONENT_INDEX::mesh_ngon;          break;

  case ON_COMPONENT_INDEX::idef_part:          t = ON_COMPONENT_INDEX::idef_part;          break;
  case ON_COMPONENT_INDEX::polycurve_segment:  t = ON_COMPONENT_INDEX::polycurve_segment;  break;
  case ON_COMPONENT_INDEX::pointcloud_point:   t = ON_COMPONENT_INDEX::pointcloud_point;   break;
  case ON_COMPONENT_INDEX::group_member:       t = ON_COMPONENT_INDEX::group_member;       break;

  case ON_COMPONENT_INDEX::extrusion_bottom_profile: t = ON_COMPONENT_INDEX::extrusion_bottom_profile; break;
  case ON_COMPONENT_INDEX::extrusion_top_profile:    t = ON_COMPONENT_INDEX::extrusion_top_profile;    break;
  case ON_COMPONENT_INDEX::extrusion_wall_edge:      t = ON_COMPONENT_INDEX::extrusion_wall_edge;      break;
  case ON_COMPONENT_INDEX::extrusion_wall_surface:   t = ON_COMPONENT_INDEX::extrusion_wall_surface;   break;
  case ON_COMPONENT_INDEX::extrusion_cap_surface:    t = ON_COMPONENT_INDEX::extrusion_cap_surface;    break;
  case ON_COMPONENT_INDEX::extrusion_path:           t = ON_COMPONENT_INDEX::extrusion_path;           break;

  case ON_COMPONENT_INDEX::subd_vertex:        t = ON_COMPONENT_INDEX::subd_vertex;        break;
  case ON_COMPONENT_INDEX::subd_edge:          t = ON_COMPONENT_INDEX::subd_edge;          break;
  case ON_COMPONENT_INDEX::subd_face:          t = ON_COMPONENT_INDEX::subd_face;          break;

  case ON_COMPONENT_INDEX::hatch_loop:         t = ON_COMPONENT_INDEX::hatch_loop;         break;

  case ON_COMPONENT_INDEX::dim_linear_point:   t = ON_COMPONENT_INDEX::dim_linear_point;   break;
  case ON_COMPONENT_INDEX::dim_radial_point:   t = ON_COMPONENT_INDEX::dim_radial_point;   break;
  case ON_COMPONENT_INDEX::dim_angular_point:  t = ON_COMPONENT_INDEX::dim_angular_point;  break;
  case ON_COMPONENT_INDEX::dim_ordinate_point: t = ON_COMPONENT_INDEX::dim_ordinate_point; break;
  case ON_COMPONENT_INDEX::dim_text_point:     t = ON_COMPONENT_INDEX::dim_text_point;     break;
  case ON_COMPONENT_INDEX::dim_centermark_point:     t = ON_COMPONENT_INDEX::dim_centermark_point;     break;
  case ON_COMPONENT_INDEX::dim_leader_point:         t = ON_COMPONENT_INDEX::dim_leader_point;         break;
  }
  return t;
}